

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

void dosinkring(obj *obj)

{
  obj *poVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char *local_48;
  char *local_38;
  boolean ring_in_inv;
  boolean ideed;
  obj *otmp2;
  obj *otmp;
  obj *obj_local;
  
  bVar2 = true;
  bVar7 = obj->where != '\x03';
  if (bVar7) {
    pcVar5 = doname(obj);
    pcVar5 = upstart(pcVar5);
    pline("%s falls down the drain.",pcVar5);
  }
  else {
    pcVar5 = doname(obj);
    pline("You drop %s down the drain.",pcVar5);
  }
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 0x800000;
  switch(obj->otyp) {
  case 0x9e:
    pcVar5 = "strong";
    if (obj->spe < '\0') {
      pcVar5 = "weak";
    }
    pline("The water flow seems %ser now.",pcVar5);
    break;
  case 0x9f:
    pcVar5 = "great";
    if (obj->spe < '\0') {
      pcVar5 = "less";
    }
    pline("The water flow seems %ser now.",pcVar5);
    break;
  case 0xa0:
    pcVar5 = "bright";
    if (obj->spe < '\0') {
      pcVar5 = "dimm";
    }
    pline("The water seems %ser now.",pcVar5);
    break;
  case 0xa1:
    pcVar5 = "quick";
    if (obj->spe < '\0') {
      pcVar5 = "dull";
    }
    pline("The water flow seems %ser now.",pcVar5);
    break;
  case 0xa2:
    pcVar5 = ", fast";
    if (obj->spe < '\0') {
      pcVar5 = ", slow";
    }
    pline("The water flow seems %ser now.",pcVar5 + 2);
    break;
  case 0xa3:
    pcVar5 = "A gush of water hits";
    if (obj->spe < '\0') {
      pcVar5 = "poisoned needle misses";
    }
    pline("The water flow %s the drain.",pcVar5 + 0x10);
    break;
  case 0xa4:
    pcVar5 = "great";
    if (obj->spe < '\0') {
      pcVar5 = "small";
    }
    pline("The water\'s force seems %ser now.",pcVar5);
    break;
  default:
    bVar2 = false;
    break;
  case 0xa7:
    pcVar5 = xname(obj);
    pline("You thought your %s got lost in the sink, but there it is!",pcVar5);
    goto LAB_001922c4;
  case 0xa9:
    pline("The water flow seems fixed.");
    break;
  case 0xaa:
    pline("The sink quivers upward for a moment.");
    break;
  case 0xab:
    bVar2 = false;
    poVar1 = level->objects[u.ux][u.uy];
    while (otmp2 = poVar1, otmp2 != (obj *)0x0) {
      poVar1 = (otmp2->v).v_nexthere;
      if (((otmp2 != uball) && (otmp2 != uchain)) &&
         (bVar3 = obj_resists(otmp2,1,99), bVar3 == '\0')) {
        if ((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pcVar5 = doname(otmp2);
          pcVar6 = otense(otmp2,"vanish");
          pline("Suddenly, %s %s from the sink!",pcVar5,pcVar6);
          bVar2 = true;
        }
        delobj(otmp2);
      }
    }
    break;
  case 0xac:
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
      local_38 = "flies";
    }
    else {
      pcVar5 = rndmonnam();
      local_38 = makeplural(pcVar5);
    }
    pline("Several %s buzz angrily around the sink.",local_38);
    break;
  case 0xad:
    You_hear("loud noises coming from the drain.");
    break;
  case 0xaf:
    pcVar5 = fruitname('\0');
    pcVar5 = makeplural(pcVar5);
    pline("You smell rotten %s.",pcVar5);
    break;
  case 0xb2:
    pline("Static electricity surrounds the sink.");
    break;
  case 0xb4:
    pline("The ring is regurgitated!");
LAB_001922c4:
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xff7fffff;
    dropx(obj);
    discover_object((int)obj->otyp,'\x01','\x01');
    return;
  case 0x113:
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
      local_48 = "flies";
    }
    else {
      pcVar5 = rndmonnam();
      local_48 = makeplural(pcVar5);
    }
    pline("Several %s buzz around the sink.",local_48);
  }
  if ((((u.uprops[0x1e].intrinsic == 0) &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
     ((!bVar2 && (obj->otyp != 0xab)))) {
    bVar2 = true;
    switch(obj->otyp) {
    case 0x9d:
      pline("The faucets flash brightly for a moment.");
      break;
    case 0xa5:
      pcVar5 = "silver";
      if (obj->spe < '\0') {
        pcVar5 = "black";
      }
      pcVar5 = hcolor(pcVar5);
      pline("The sink glows %s for a moment.",pcVar5);
      break;
    case 0xa6:
      pline("The sink looks as good as new.");
      break;
    case 0xa8:
      pline("The sink seems to blend into the floor for a moment.");
      break;
    case 0xae:
      pcVar5 = hcolor("red");
      pline("The sink glows %s for a moment.",pcVar5);
      break;
    case 0xb0:
      pline("The hot water faucet flashes brightly for a moment.");
      break;
    case 0xb1:
      pline("The cold water faucet flashes brightly for a moment.");
      break;
    case 0xb3:
      pline("You see the ring slide right down the drain!");
      break;
    case 0xb5:
      bVar3 = teleport_sink();
      if (bVar3 == '\0') {
        pline("The sink momentarily vanishes.");
      }
      else {
        pline("The sink vanishes!");
      }
      break;
    case 0xb6:
      pline("The sink looks like it is being beamed aboard somewhere.");
      break;
    case 0xb7:
      polymorph_sink();
      break;
    case 0xb8:
      pline("The sink transforms into another sink!");
      *(uint *)&level->locations[u.ux][u.uy].field_0x6 =
           *(uint *)&level->locations[u.ux][u.uy].field_0x6 & 0xfffffe0f;
      break;
    case 0xb9:
      pline("The water flow momentarily vanishes.");
      break;
    case 0xba:
      bVar8 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar8 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar8 = false, u.umonnum != u.umonster)) {
          bVar3 = dmgtype(youmonst.data,0x24);
          bVar8 = bVar3 != '\0';
        }
        bVar8 = (bool)(bVar8 ^ 1);
      }
      pcVar5 = "air";
      if (bVar8) {
        pcVar5 = "oxygen molecules";
      }
      pline("You see some %s in the sink.",pcVar5);
      break;
    case 0xbb:
      pline("The sink looks nothing like a fountain.");
    }
  }
  if (bVar2) {
    discover_object((int)obj->otyp,'\x01','\x01');
  }
  else {
    You_hear("the ring bouncing down the drainpipe.");
  }
  iVar4 = rn2(0x14);
  if (iVar4 == 0) {
    pcVar5 = doname(obj);
    pline("The sink backs up, leaving %s.",pcVar5);
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xff7fffff;
    dropx(obj);
  }
  else if (bVar7) {
    obfree(obj,(obj *)0x0);
  }
  else {
    useup(obj);
  }
  return;
}

Assistant:

static void dosinkring(struct obj *obj)  /* obj is a ring being dropped over a kitchen sink */
{
	struct obj *otmp,*otmp2;
	boolean ideed = TRUE;
	boolean ring_in_inv = carried(obj);

	if (ring_in_inv)
	    pline("You drop %s down the drain.", doname(obj));
	else
	    pline("%s falls down the drain.", upstart(doname(obj)));

	obj->in_use = TRUE;	/* block free identification via interrupt */
	switch(obj->otyp) {	/* effects that can be noticed without eyes */
	    case RIN_SEARCHING:
		pline("You thought your %s got lost in the sink, but there it is!",
			xname(obj));
		goto giveback;
	    case RIN_SLOW_DIGESTION:
		pline("The ring is regurgitated!");
giveback:
		obj->in_use = FALSE;
		dropx(obj);
		makeknown(obj->otyp);
		return;
	    case RIN_LEVITATION:
		pline("The sink quivers upward for a moment.");
		break;
	    case RIN_POISON_RESISTANCE:
		pline("You smell rotten %s.", makeplural(fruitname(FALSE)));
		break;
	    case RIN_AGGRAVATE_MONSTER:
		pline("Several %s buzz angrily around the sink.",
		      Hallucination ? makeplural(rndmonnam()) : "flies");
		break;
	    case RIN_SHOCK_RESISTANCE:
		pline("Static electricity surrounds the sink.");
		break;
	    case RIN_CONFLICT:
		You_hear("loud noises coming from the drain.");
		break;
	    case RIN_SUSTAIN_ABILITY:	/* KMH */
		pline("The water flow seems fixed.");
		break;
	    case RIN_GAIN_STRENGTH:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "weak" : "strong");
		break;
	    case RIN_GAIN_CONSTITUTION:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "less" : "great");
		break;
	    case RIN_GAIN_INTELLIGENCE:
		pline("The water seems %ser now.",
			(obj->spe<0) ? "dimm" : "bright");
		break;
	    case RIN_GAIN_WISDOM:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "dull" : "quick");
		break;
	    case RIN_GAIN_DEXTERITY:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "slow" : "fast");
		break;
	    case RIN_INCREASE_ACCURACY:	/* KMH */
		pline("The water flow %s the drain.",
			(obj->spe<0) ? "misses" : "hits");
		break;
	    case RIN_INCREASE_DAMAGE:
		pline("The water's force seems %ser now.",
			(obj->spe<0) ? "small" : "great");
		break;
	    case RIN_HUNGER:
		ideed = FALSE;
		for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp2) {
		    otmp2 = otmp->nexthere;
		    if (otmp != uball && otmp != uchain &&
			    !obj_resists(otmp, 1, 99)) {
			if (!Blind) {
			    pline("Suddenly, %s %s from the sink!",
				  doname(otmp), otense(otmp, "vanish"));
			    ideed = TRUE;
			}
			delobj(otmp);
		    }
		}
		break;
	    case MEAT_RING:
		/* Not the same as aggravate monster; besides, it's obvious. */
		pline("Several %s buzz around the sink.",
		      Hallucination ? makeplural(rndmonnam()) : "flies");
		break;
	    default:
		ideed = FALSE;
		break;
	}
	if (!Blind && !ideed && obj->otyp != RIN_HUNGER) {
	    ideed = TRUE;
	    switch(obj->otyp) {		/* effects that need eyes */
		case RIN_ADORNMENT:
		    pline("The faucets flash brightly for a moment.");
		    break;
		case RIN_REGENERATION:
		    pline("The sink looks as good as new.");
		    break;
		case RIN_INVISIBILITY:
		    pline("The water flow momentarily vanishes.");
		    break;
		case RIN_FREE_ACTION:
		    pline("You see the ring slide right down the drain!");
		    break;
		case RIN_SEE_INVISIBLE:
		    pline("You see some %s in the sink.",
			  Hallucination ? "oxygen molecules" : "air");
		    break;
		case RIN_STEALTH:
		pline("The sink seems to blend into the floor for a moment.");
		    break;
		case RIN_FIRE_RESISTANCE:
		pline("The hot water faucet flashes brightly for a moment.");
		    break;
		case RIN_COLD_RESISTANCE:
		pline("The cold water faucet flashes brightly for a moment.");
		    break;
		case RIN_PROTECTION_FROM_SHAPE_CHANGERS:
		    pline("The sink looks nothing like a fountain.");
		    break;
		case RIN_PROTECTION:
		    pline("The sink glows %s for a moment.",
			    hcolor((obj->spe<0) ? "black" : "silver"));
		    break;
		case RIN_WARNING:
		    pline("The sink glows %s for a moment.", hcolor("red"));
		    break;
		case RIN_TELEPORTATION:
		    if (teleport_sink())
			pline("The sink vanishes!");
		    else
			pline("The sink momentarily vanishes.");
		    break;
		case RIN_TELEPORT_CONTROL:
	    pline("The sink looks like it is being beamed aboard somewhere.");
		    break;
		case RIN_POLYMORPH:
		    polymorph_sink();
		    break;
		case RIN_POLYMORPH_CONTROL:
		    pline("The sink transforms into another sink!");
		    level->locations[u.ux][u.uy].looted = 0;
		    break;
	    }
	}
	if (ideed)
	    makeknown(obj->otyp);
	else
	    You_hear("the ring bouncing down the drainpipe.");
	if (!rn2(20)) {
		pline("The sink backs up, leaving %s.", doname(obj));
		obj->in_use = FALSE;
		dropx(obj);
	} else {
	    if (ring_in_inv)
		useup(obj);
	    else
		obfree(obj, NULL);
	}
}